

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_reparent.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *ctx;
  ALLEGRO_EVENT event;
  _Bool need_redraw;
  _Bool done;
  int h;
  int w;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_TIMER *timer;
  int local_78 [2];
  undefined8 local_70;
  int local_58;
  byte local_2a;
  byte local_29;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_4;
  
  local_4 = 0;
  local_24 = 800;
  local_28 = 600;
  local_29 = 0;
  local_2a = 1;
  uVar1 = al_install_system(0x5020700,atexit);
  if ((uVar1 & 1) == 0) {
    abort_example("Failed to init Allegro.\n");
  }
  uVar1 = al_init_image_addon();
  if ((uVar1 & 1) == 0) {
    abort_example("Failed to init IIO addon.\n");
  }
  al_init_primitives_addon();
  init_platform_specific();
  al_set_new_bitmap_flags(0xc0);
  al_set_new_display_flags(0x10);
  example.display = (ALLEGRO_DISPLAY *)al_create_display(local_24,local_28);
  if (example.display == (ALLEGRO_DISPLAY *)0x0) {
    abort_example("Error creating display.\n");
  }
  uVar1 = al_install_keyboard();
  if ((uVar1 & 1) == 0) {
    abort_example("Error installing keyboard.\n");
  }
  example.glyphs[0] = (ALLEGRO_BITMAP *)al_load_bitmap("data/font.tga");
  if (example.glyphs[0] == (ALLEGRO_BITMAP *)0x0) {
    abort_example("Error loading data/font.tga\n");
  }
  ctx = "data/bmpfont.tga";
  example.glyphs[1] = (ALLEGRO_BITMAP *)al_load_bitmap();
  if (example.glyphs[1] == (ALLEGRO_BITMAP *)0x0) {
    ctx = "Error loading data/bmpfont.tga\n";
    abort_example();
  }
  init((EVP_PKEY_CTX *)ctx);
  local_18 = al_create_timer(0x3f91111111111111);
  uVar2 = al_create_event_queue();
  local_20 = uVar2;
  uVar3 = al_get_keyboard_event_source();
  al_register_event_source(uVar2,uVar3);
  uVar2 = local_20;
  uVar3 = al_get_timer_event_source(local_18);
  al_register_event_source(uVar2,uVar3);
  uVar2 = local_20;
  uVar3 = al_get_display_event_source(example.display);
  al_register_event_source(uVar2,uVar3);
  al_start_timer(local_18);
  while (((local_29 ^ 0xff) & 1) != 0) {
    local_24 = al_get_display_width(example.display);
    local_28 = al_get_display_height(example.display);
    if (((local_2a & 1) != 0) && (uVar1 = al_is_event_queue_empty(local_20), (uVar1 & 1) != 0)) {
      redraw();
      al_flip_display();
      local_2a = 0;
    }
    al_wait_for_event(local_20,local_78);
    if (local_78[0] - 0xbU < 0x1f || local_78[0] == 0x2a) {
      switch((long)&switchD_00102778::switchdataD_00103020 +
             (long)(int)(&switchD_00102778::switchdataD_00103020)[local_78[0] - 0xbU]) {
      case 0x10277a:
        if (local_58 == 0x3b) {
          local_29 = 1;
        }
        break;
      case 0x102788:
        local_29 = 1;
        break;
      case 0x10278f:
        al_acknowledge_resize(local_70);
        break;
      case 0x10279b:
        update();
        local_2a = 1;
      }
    }
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   int w = 800, h = 600;
   bool done = false;
   bool need_redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   if (!al_init_image_addon()) {
      abort_example("Failed to init IIO addon.\n");
   }

   al_init_primitives_addon();

   init_platform_specific();

   al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR);
   al_set_new_display_flags(ALLEGRO_RESIZABLE);
   example.display = al_create_display(w, h);
   if (!example.display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   example.glyphs[0] = al_load_bitmap("data/font.tga");
   if (!example.glyphs[0]) {
      abort_example("Error loading data/font.tga\n");
   }

   example.glyphs[1] = al_load_bitmap("data/bmpfont.tga");
   if (!example.glyphs[1]) {
      abort_example("Error loading data/bmpfont.tga\n");
   }

   init();

   timer = al_create_timer(1.0 / FPS);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());

   al_register_event_source(queue, al_get_timer_event_source(timer));
   
   al_register_event_source(queue, al_get_display_event_source(
      example.display));

   al_start_timer(timer);

   while (!done) {
      ALLEGRO_EVENT event;
      w = al_get_display_width(example.display);
      h = al_get_display_height(example.display);

      if (need_redraw && al_is_event_queue_empty(queue)) {
         redraw();
         al_flip_display();
         need_redraw = false;
      }

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_CHAR:
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
               done = true;
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            done = true;
            break;
         
         case ALLEGRO_EVENT_DISPLAY_RESIZE:
            al_acknowledge_resize(event.display.source);
            break;
              
         case ALLEGRO_EVENT_TIMER:
            update();
            need_redraw = true;
            break;
      }
   }

   return 0;
}